

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

void __thiscall slang::ast::PortConnection::PortConnection(PortConnection *this,Symbol *port)

{
  Symbol *port_local;
  PortConnection *this_local;
  
  this->port = port;
  this->connectedSymbol = (Symbol *)0x0;
  this->expr = (Expression *)0x0;
  this->modport = (ModportSymbol *)0x0;
  (this->field_4).exprSyntax = (ExpressionSyntax *)0x0;
  this->useDefault = false;
  this->isImplicit = false;
  return;
}

Assistant:

PortConnection::PortConnection(const Symbol& port) : port(port) {
}